

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npp.cpp
# Opt level: O3

void __thiscall pg::NPPSolver::atronsubgamedw(NPPSolver *this)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Game *pGVar5;
  uint64_t *puVar6;
  uint64_t *puVar7;
  uint64_t *puVar8;
  uint *puVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int *piVar15;
  bitset *this_00;
  ulong uVar16;
  ulong uVar17;
  int to_1;
  _Map_pointer ppuVar18;
  int to;
  ulong uVar19;
  deque<unsigned_int,_std::allocator<unsigned_int>_> *pdVar20;
  bitset *pbVar21;
  uint *puVar22;
  uint local_80;
  uint local_7c;
  bitset *local_78;
  bitset *local_70;
  deque<unsigned_int,_std::allocator<unsigned_int>_> *local_68;
  bitset *local_60;
  long local_58;
  _Map_pointer local_50;
  uint64_t *local_48;
  _Elt_pointer local_40;
  _Elt_pointer local_38;
  
  pdVar20 = (this->Heads).
            super__Vector_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start[this->Top];
  local_38 = ((iterator *)
             ((long)&(pdVar20->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Deque_impl_data + 0x30))->_M_cur;
  local_60 = (bitset *)
             ((iterator *)
             ((long)&(pdVar20->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Deque_impl_data + 0x10))->_M_cur;
  if (local_60 != (bitset *)local_38) {
    local_40 = *(_Elt_pointer *)
                ((long)&(pdVar20->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Deque_impl_data + 0x20);
    local_50 = *(_Map_pointer *)
                ((long)&(pdVar20->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Deque_impl_data + 0x28);
    do {
      pGVar5 = (this->super_Solver).game;
      local_58 = (long)(int)*(uint *)local_60;
      piVar15 = pGVar5->_inedges;
      iVar11 = pGVar5->_firstins[local_58];
      uVar2 = piVar15[iVar11];
      if (uVar2 != 0xffffffff) {
        piVar15 = piVar15 + iVar11;
        pbVar21 = (this->Supgame).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[this->Top];
        pdVar20 = (deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                  (*(long *)&((this->Entries).
                              super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[this->Top]->
                             super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             )._M_impl._M_node + 0x10);
        local_78 = pbVar21;
        do {
          uVar10 = (ulong)uVar2;
          puVar6 = (this->outgame)._bits;
          uVar19 = (ulong)(int)uVar2;
          uVar12 = uVar19 >> 6;
          if ((puVar6[uVar12] >> (uVar10 & 0x3f) & 1) == 0) {
            uVar13 = 1L << (uVar10 & 0x3f);
            if ((pbVar21->_bits[uVar12] & uVar13) == 0) {
              pGVar5 = (this->super_Solver).game;
              puVar8 = (this->R)._bits;
              uVar16 = puVar8[uVar12];
              if (this->alpha == (uint)(((pGVar5->_owner)._bits[uVar12] & uVar13) != 0)) {
                if ((uVar16 & uVar13) == 0) {
                  puVar8[uVar12] = uVar16 | uVar13;
                  this->strategy[uVar19] = (int)local_58;
LAB_0014f546:
                  iVar11 = (this->T).pointer;
                  (this->T).pointer = iVar11 + 1;
                  (this->T).queue[iVar11] = uVar2;
                }
                else {
                  puVar6 = (this->O)._bits;
                  uVar10 = puVar6[uVar12];
                  if ((uVar10 & uVar13) != 0) {
                    puVar6[uVar12] = ~uVar13 & uVar10;
                    this->strategy[uVar19] = (int)local_58;
                  }
                }
              }
              else {
                if ((uVar16 & uVar13) == 0) {
                  uVar3 = pGVar5->_outedges[pGVar5->_firstouts[uVar19]];
                  local_68 = pdVar20;
                  if (uVar3 != 0xffffffff) {
                    local_70 = (bitset *)(this->E).queue;
                    puVar22 = (uint *)(pGVar5->_outedges + (long)pGVar5->_firstouts[uVar19] + 1);
                    pbVar21 = (this->Supgame).
                              super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->Top];
                    do {
                      uVar19 = (ulong)(long)(int)uVar3 >> 6;
                      if (((puVar6[uVar19] >> ((ulong)uVar3 & 0x3f) & 1) == 0) &&
                         (uVar17 = 1L << ((ulong)uVar3 & 0x3f), (puVar8[uVar19] & uVar17) == 0)) {
                        if ((pbVar21->_bits[uVar19] & uVar17) == 0) {
                          (this->E).pointer = 0;
                          pbVar21 = local_78;
                          goto LAB_0014f27b;
                        }
                        iVar11 = (this->E).pointer;
                        (this->E).pointer = iVar11 + 1;
                        *(uint *)((long)&local_70->_bits + (long)iVar11 * 4) = uVar3;
                      }
                      uVar3 = *puVar22;
                      puVar22 = puVar22 + 1;
                    } while (uVar3 != 0xffffffff);
                  }
                  iVar11 = (this->E).pointer;
                  lVar14 = (long)iVar11;
                  if (lVar14 != 0) {
                    puVar9 = (this->E).queue;
                    puVar6 = (this->Exits).
                             super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl
                             .super__Vector_impl_data._M_start[this->Pivot]->_bits;
                    do {
                      iVar11 = iVar11 + -1;
                      (this->E).pointer = iVar11;
                      uVar3 = puVar9[lVar14 + -1];
                      puVar1 = puVar6 + (uVar3 >> 6);
                      *puVar1 = *puVar1 | 1L << ((ulong)uVar3 & 0x3f);
                      lVar14 = lVar14 + -1;
                    } while (lVar14 != 0);
                    uVar16 = puVar8[uVar12];
                  }
                  this->strategy[uVar10] = -1;
                  puVar8[uVar12] = uVar16 | uVar13;
                  pbVar21 = local_78;
                  goto LAB_0014f546;
                }
                puVar7 = (this->O)._bits;
                uVar16 = puVar7[uVar12];
                if ((uVar16 & uVar13) != 0) {
                  uVar2 = pGVar5->_outedges[pGVar5->_firstouts[uVar19]];
                  local_48 = puVar7;
                  if (uVar2 != 0xffffffff) {
                    puVar22 = (uint *)(pGVar5->_outedges + (long)pGVar5->_firstouts[uVar19] + 1);
                    local_70 = (this->Supgame).
                               super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                               _M_impl.super__Vector_impl_data._M_start[this->Top];
                    local_68 = (deque<unsigned_int,_std::allocator<unsigned_int>_> *)(this->E).queue
                    ;
                    do {
                      uVar19 = (ulong)(long)(int)uVar2 >> 6;
                      if (((puVar6[uVar19] >> ((ulong)uVar2 & 0x3f) & 1) == 0) &&
                         (uVar17 = 1L << ((ulong)uVar2 & 0x3f), (puVar8[uVar19] & uVar17) == 0)) {
                        if ((local_70->_bits[uVar19] & uVar17) == 0) {
                          (this->E).pointer = 0;
                          pbVar21 = local_78;
                          goto LAB_0014f27b;
                        }
                        iVar11 = (this->E).pointer;
                        (this->E).pointer = iVar11 + 1;
                        *(uint *)((long)&(local_68->
                                         super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         )._M_impl.super__Deque_impl_data._M_map + (long)iVar11 * 4)
                             = uVar2;
                      }
                      uVar2 = *puVar22;
                      puVar22 = puVar22 + 1;
                    } while (uVar2 != 0xffffffff);
                  }
                  iVar11 = (this->E).pointer;
                  lVar14 = (long)iVar11;
                  if (lVar14 != 0) {
                    puVar9 = (this->E).queue;
                    puVar6 = (this->Exits).
                             super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl
                             .super__Vector_impl_data._M_start[this->Pivot]->_bits;
                    do {
                      iVar11 = iVar11 + -1;
                      (this->E).pointer = iVar11;
                      uVar2 = puVar9[lVar14 + -1];
                      puVar1 = puVar6 + (uVar2 >> 6);
                      *puVar1 = *puVar1 | 1L << ((ulong)uVar2 & 0x3f);
                      lVar14 = lVar14 + -1;
                    } while (lVar14 != 0);
                    uVar16 = puVar7[uVar12];
                  }
                  this->strategy[uVar10] = -1;
                  puVar7[uVar12] = ~uVar13 & uVar16;
                  pbVar21 = local_78;
                }
              }
            }
            else {
              local_7c = uVar2;
              std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        (pdVar20,&local_7c);
            }
          }
LAB_0014f27b:
          uVar2 = piVar15[1];
          piVar15 = piVar15 + 1;
        } while (uVar2 != 0xffffffff);
      }
      local_60 = (bitset *)((long)local_60 + 4);
      if (local_60 == (bitset *)local_40) {
        local_60 = (bitset *)local_50[1];
        local_50 = local_50 + 1;
        local_40 = (_Elt_pointer)((long)local_60 + 0x200);
      }
    } while (local_60 != (bitset *)local_38);
  }
  iVar11 = (this->T).pointer;
joined_r0x0014f5e0:
  do {
    if (iVar11 == 0) {
      return;
    }
    lVar14 = (long)iVar11;
    iVar11 = iVar11 + -1;
    (this->T).pointer = iVar11;
    pGVar5 = (this->super_Solver).game;
    local_58 = (long)(int)(this->T).queue[lVar14 + -1];
    piVar15 = pGVar5->_inedges;
    iVar4 = pGVar5->_firstins[local_58];
    local_80 = piVar15[iVar4];
  } while (local_80 == 0xffffffff);
  piVar15 = piVar15 + iVar4;
  pbVar21 = (this->Supgame).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
            super__Vector_impl_data._M_start[this->Top];
  this_00 = (bitset *)
            (*(long *)&((this->Entries).
                        super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[this->Top]->
                       super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl._M_node + 0x10);
  local_70 = this_00;
  local_60 = pbVar21;
LAB_0014f65a:
  uVar10 = (ulong)local_80;
  puVar6 = (this->outgame)._bits;
  uVar19 = (ulong)(int)local_80;
  uVar12 = uVar19 >> 6;
  if ((puVar6[uVar12] >> (uVar10 & 0x3f) & 1) == 0) {
    uVar13 = 1L << (uVar10 & 0x3f);
    if ((pbVar21->_bits[uVar12] & uVar13) == 0) {
      pGVar5 = (this->super_Solver).game;
      puVar8 = (this->R)._bits;
      uVar16 = puVar8[uVar12];
      if (this->alpha == (uint)(((pGVar5->_owner)._bits[uVar12] & uVar13) != 0)) {
        if ((uVar16 & uVar13) == 0) {
          puVar8[uVar12] = uVar16 | uVar13;
          this->strategy[uVar19] = (int)local_58;
LAB_0014f946:
          iVar11 = (this->T).pointer;
          (this->T).pointer = iVar11 + 1;
          (this->T).queue[iVar11] = local_80;
        }
        else {
          puVar6 = (this->O)._bits;
          uVar10 = puVar6[uVar12];
          if ((uVar10 & uVar13) != 0) {
            puVar6[uVar12] = ~uVar13 & uVar10;
            this->strategy[uVar19] = (int)local_58;
          }
        }
      }
      else {
        if ((uVar16 & uVar13) == 0) {
          uVar2 = pGVar5->_outedges[pGVar5->_firstouts[uVar19]];
          if (uVar2 != 0xffffffff) {
            local_78 = (bitset *)(this->E).queue;
            puVar22 = (uint *)(pGVar5->_outedges + (long)pGVar5->_firstouts[uVar19] + 1);
            pbVar21 = (this->Supgame).
                      super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
                      super__Vector_impl_data._M_start[this->Top];
            do {
              uVar19 = (ulong)(long)(int)uVar2 >> 6;
              if (((puVar6[uVar19] >> ((ulong)uVar2 & 0x3f) & 1) == 0) &&
                 (uVar17 = 1L << ((ulong)uVar2 & 0x3f), (puVar8[uVar19] & uVar17) == 0)) {
                if ((pbVar21->_bits[uVar19] & uVar17) == 0) goto LAB_0014f965;
                iVar11 = (this->E).pointer;
                (this->E).pointer = iVar11 + 1;
                *(uint *)((long)&local_78->_bits + (long)iVar11 * 4) = uVar2;
              }
              uVar2 = *puVar22;
              puVar22 = puVar22 + 1;
            } while (uVar2 != 0xffffffff);
          }
          iVar11 = (this->E).pointer;
          lVar14 = (long)iVar11;
          if (lVar14 != 0) {
            puVar9 = (this->E).queue;
            puVar6 = (this->Exits).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[this->Pivot]->_bits;
            do {
              iVar11 = iVar11 + -1;
              (this->E).pointer = iVar11;
              uVar2 = puVar9[lVar14 + -1];
              puVar1 = puVar6 + (uVar2 >> 6);
              *puVar1 = *puVar1 | 1L << ((ulong)uVar2 & 0x3f);
              lVar14 = lVar14 + -1;
            } while (lVar14 != 0);
            uVar16 = puVar8[uVar12];
          }
          this->strategy[uVar10] = -1;
          puVar8[uVar12] = uVar16 | uVar13;
          this_00 = local_70;
          pbVar21 = local_60;
          goto LAB_0014f946;
        }
        pdVar20 = (deque<unsigned_int,_std::allocator<unsigned_int>_> *)(this->O)._bits;
        ppuVar18 = (&(pdVar20->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Deque_impl_data._M_map)[uVar12];
        if (((ulong)ppuVar18 & uVar13) != 0) {
          uVar2 = pGVar5->_outedges[pGVar5->_firstouts[uVar19]];
          local_68 = pdVar20;
          if (uVar2 != 0xffffffff) {
            local_78 = (bitset *)(this->E).queue;
            puVar22 = (uint *)(pGVar5->_outedges + (long)pGVar5->_firstouts[uVar19] + 1);
            pbVar21 = (this->Supgame).
                      super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
                      super__Vector_impl_data._M_start[this->Top];
            do {
              uVar19 = (ulong)(long)(int)uVar2 >> 6;
              if (((puVar6[uVar19] >> ((ulong)uVar2 & 0x3f) & 1) == 0) &&
                 (uVar16 = 1L << ((ulong)uVar2 & 0x3f), (puVar8[uVar19] & uVar16) == 0)) {
                if ((pbVar21->_bits[uVar19] & uVar16) == 0) goto LAB_0014f965;
                iVar11 = (this->E).pointer;
                (this->E).pointer = iVar11 + 1;
                *(uint *)((long)&local_78->_bits + (long)iVar11 * 4) = uVar2;
              }
              uVar2 = *puVar22;
              puVar22 = puVar22 + 1;
            } while (uVar2 != 0xffffffff);
          }
          iVar11 = (this->E).pointer;
          lVar14 = (long)iVar11;
          if (lVar14 != 0) {
            puVar9 = (this->E).queue;
            puVar6 = (this->Exits).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[this->Pivot]->_bits;
            do {
              iVar11 = iVar11 + -1;
              (this->E).pointer = iVar11;
              uVar2 = puVar9[lVar14 + -1];
              puVar1 = puVar6 + (uVar2 >> 6);
              *puVar1 = *puVar1 | 1L << ((ulong)uVar2 & 0x3f);
              lVar14 = lVar14 + -1;
            } while (lVar14 != 0);
            ppuVar18 = (&(pdVar20->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Deque_impl_data._M_map)[uVar12];
          }
          this->strategy[uVar10] = -1;
          (&(pdVar20->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Deque_impl_data._M_map)[uVar12] = (_Map_pointer)(~uVar13 & (ulong)ppuVar18);
          this_00 = local_70;
          pbVar21 = local_60;
        }
      }
    }
    else {
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,&local_80);
    }
  }
  goto LAB_0014f690;
LAB_0014f965:
  (this->E).pointer = 0;
  this_00 = local_70;
  pbVar21 = local_60;
LAB_0014f690:
  local_80 = piVar15[1];
  piVar15 = piVar15 + 1;
  if (local_80 == 0xffffffff) goto LAB_0014f983;
  goto LAB_0014f65a;
LAB_0014f983:
  iVar11 = (this->T).pointer;
  goto joined_r0x0014f5e0;
}

Assistant:

void NPPSolver::atronsubgamedw()
{
    auto & heads = *(Heads[Top]);
    auto qend = heads.end();
    for (auto qiter = heads.begin(); qiter != qend; ++qiter)
    {
        pushinqueueonsubgamedw(*qiter);
    }
    while (T.nonempty())
    {
        pushinqueueonsubgamedw(T.pop());
    }
}